

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_test.cpp
# Opt level: O2

void TestEventComparisonNode(void)

{
  bool bVar1;
  allocator<char> local_ea;
  allocator<char> local_e9;
  string local_e8;
  Date january_1;
  EventComparisonNode greater;
  string local_88;
  EventComparisonNode equal;
  EventComparisonNode less_eq;
  
  january_1.day = 1;
  january_1.year = 0x7b2;
  january_1.month = 1;
  greater.super_Node._vptr_Node._0_4_ = january_1.day;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&equal,"b",(allocator<char> *)&local_e8);
  EventComparisonNode::EventComparisonNode(&less_eq,(Comparison *)&greater,(string *)&equal);
  std::__cxx11::string::~string((string *)&equal);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&equal,"a",(allocator<char> *)&local_e8);
  bVar1 = EventComparisonNode::Evaluate(&less_eq,&january_1,(string *)&equal);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&greater,"EventComparisonNode: less_eq 1",(allocator<char> *)&local_88);
  Assert(bVar1,(string *)&greater);
  std::__cxx11::string::~string((string *)&greater);
  std::__cxx11::string::~string((string *)&equal);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&equal,"c",(allocator<char> *)&local_e8);
  bVar1 = EventComparisonNode::Evaluate(&less_eq,&january_1,(string *)&equal);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&greater,"EventComparisonNode: less_eq 2",(allocator<char> *)&local_88);
  Assert(!bVar1,(string *)&greater);
  std::__cxx11::string::~string((string *)&greater);
  std::__cxx11::string::~string((string *)&equal);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&equal,"b",(allocator<char> *)&local_e8);
  bVar1 = EventComparisonNode::Evaluate(&less_eq,&january_1,(string *)&equal);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&greater,"EventComparisonNode: less_eq 3",(allocator<char> *)&local_88);
  Assert(bVar1,(string *)&greater);
  std::__cxx11::string::~string((string *)&greater);
  std::__cxx11::string::~string((string *)&equal);
  local_e8._M_dataplus._M_p._0_4_ = 4;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&greater,"b",(allocator<char> *)&local_88);
  EventComparisonNode::EventComparisonNode(&equal,(Comparison *)&local_e8,(string *)&greater);
  std::__cxx11::string::~string((string *)&greater);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&greater,"b",(allocator<char> *)&local_88);
  bVar1 = EventComparisonNode::Evaluate(&equal,&january_1,(string *)&greater);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"EventComparisonNode: equal 1",&local_ea);
  Assert(bVar1,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&greater);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&greater,"a",(allocator<char> *)&local_88);
  bVar1 = EventComparisonNode::Evaluate(&equal,&january_1,(string *)&greater);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"EventComparisonNode: equal 2",&local_ea);
  Assert(!bVar1,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&greater);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&greater,"c",(allocator<char> *)&local_88);
  bVar1 = EventComparisonNode::Evaluate(&equal,&january_1,(string *)&greater);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"EventComparisonNode: equal 3",&local_ea);
  Assert(!bVar1,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&greater);
  local_88._M_dataplus._M_p._0_4_ = 2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"b",&local_ea);
  EventComparisonNode::EventComparisonNode(&greater,(Comparison *)&local_88,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"c",&local_ea);
  bVar1 = EventComparisonNode::Evaluate(&greater,&january_1,&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"EventComparisonNode: greater 1",&local_e9);
  Assert(bVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"b",&local_ea);
  bVar1 = EventComparisonNode::Evaluate(&greater,&january_1,&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"EventComparisonNode: greater 2",&local_e9);
  Assert(!bVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"a",&local_ea);
  bVar1 = EventComparisonNode::Evaluate(&greater,&january_1,&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"EventComparisonNode: greater 3",&local_e9);
  Assert(!bVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_e8);
  EventComparisonNode::~EventComparisonNode(&greater);
  EventComparisonNode::~EventComparisonNode(&equal);
  EventComparisonNode::~EventComparisonNode(&less_eq);
  return;
}

Assistant:

void TestEventComparisonNode() {
    const Date january_1{1970, 1, 1};

    EventComparisonNode less_eq(Comparison::LessOrEqual, "b");
    Assert(less_eq.Evaluate(january_1, "a"), "EventComparisonNode: less_eq 1");
    Assert(!less_eq.Evaluate(january_1, "c"), "EventComparisonNode: less_eq 2");
    Assert(less_eq.Evaluate(january_1, "b"), "EventComparisonNode: less_eq 3");

    EventComparisonNode equal(Comparison::Equal, "b");
    Assert(equal.Evaluate(january_1, "b"), "EventComparisonNode: equal 1");
    Assert(!equal.Evaluate(january_1, "a"), "EventComparisonNode: equal 2");
    Assert(!equal.Evaluate(january_1, "c"), "EventComparisonNode: equal 3");

    EventComparisonNode greater(Comparison::Greater, "b");
    Assert(greater.Evaluate(january_1, "c"), "EventComparisonNode: greater 1");
    Assert(!greater.Evaluate(january_1, "b"), "EventComparisonNode: greater 2");
    Assert(!greater.Evaluate(january_1, "a"), "EventComparisonNode: greater 3");
}